

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

void __thiscall CTcPrsSymtab::CTcPrsSymtab(CTcPrsSymtab *this,CTcPrsSymtab *parent_scope)

{
  CVmHashTable *this_00;
  uint uVar1;
  
  this->_vptr_CTcPrsSymtab = (_func_int **)&PTR__CTcPrsSymtab_003086a0;
  uVar1 = 0x20;
  if (parent_scope == (CTcPrsSymtab *)0x0) {
    uVar1 = 0x200;
  }
  this_00 = (CVmHashTable *)CTcPrsMem::alloc(G_prsmem,0x20);
  CTcPrsMem::alloc(G_prsmem,(ulong)(uVar1 * 8));
  CVmHashTable::init(this_00,(EVP_PKEY_CTX *)(ulong)uVar1);
  this->hashtab_ = this_00;
  this->parent_ = parent_scope;
  this->start_ofs_ = 0;
  this->end_ofs_ = 0;
  this->list_next_ = (CTcPrsSymtab *)0x0;
  this->list_index_ = 0;
  return;
}

Assistant:

CTcPrsSymtab::CTcPrsSymtab(CTcPrsSymtab *parent_scope)
{
    size_t hash_table_size;
    
    /* 
     *   Create the hash table.  If we're at global scope (parent_scope ==
     *   0), create a large hash table, since we'll probably add lots of
     *   symbols; otherwise, it's just a local table, which probably won't
     *   have many entries, so create a small table.
     *   
     *   Note that we always use the static hash function object, hence
     *   the table doesn't own the object.  
     */
    hash_table_size = (parent_scope == 0 ? 512 : 32);
    hashtab_ = new (G_prsmem)
               CVmHashTable(hash_table_size, hash_func_, FALSE,
                            new (G_prsmem) CVmHashEntry *[hash_table_size]);

    /* remember the parent scope */
    parent_ = parent_scope;

    /* we're not in a debugger frame list yet */
    list_index_ = 0;
    list_next_ = 0;

    /* we don't have a generated byte code range yet */
    start_ofs_ = end_ofs_ = 0;
}